

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O1

void __thiscall hwtest::pgraph::MthdCelsiusVtxbufFormat::emulate_mthd(MthdCelsiusVtxbufFormat *this)

{
  byte *pbVar1;
  int i;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  long lVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  
  uVar8 = (this->super_SingleMthdTest).super_MthdTest.val;
  uVar4 = *(uint *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914;
  if (7 < uVar4) {
    bVar9 = false;
    goto LAB_0020d799;
  }
  uVar2 = uVar8 >> 4 & 0xf;
  switch(uVar4) {
  case 0:
    bVar9 = uVar2 - 5 < 0xfffffffd || 0x1ffffff < uVar8;
    goto LAB_0020d799;
  default:
    uVar7 = uVar8 & 0xb0;
    break;
  case 3:
  case 4:
    bVar9 = uVar2 < 5;
    goto LAB_0020d76d;
  case 5:
    uVar7 = uVar2;
    break;
  case 6:
  case 7:
    bVar9 = uVar2 < 2;
LAB_0020d76d:
    bVar9 = !bVar9;
    goto LAB_0020d799;
  }
  bVar9 = uVar7 != 0 && uVar2 != 3;
LAB_0020d799:
  if (uVar4 - 1 < 2) {
    bVar6 = (uVar8 & 0xf) != 4 && (uVar8 & 0xd) != 0;
  }
  else {
    bVar6 = (uVar8 & 0xf) - 3 < 0xfffffffe;
  }
  uVar7 = (uint)(byte)(bVar6 | bVar9);
  uVar2 = uVar7 + 2;
  if (uVar4 == 0) {
    uVar2 = uVar7;
  }
  if (uVar8 < 0x1000000) {
    uVar2 = uVar7;
  }
  if ((uVar8 & 0xff0300) != 0) {
    uVar2 = uVar7 + 2;
  }
  if ((((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_config_c & 0x100) !=
       0) && ((uVar3 = (this->super_SingleMthdTest).super_MthdTest.cls, uVar3 == 0x85 ||
              (uVar3 == 0x56)))) {
    uVar2 = uVar2 | 4;
  }
  if (uVar2 != 0) {
    MthdTest::warn((MthdTest *)this,uVar2);
    return;
  }
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
    uVar3 = pgraph_celsius_fixup_vtxbuf_format
                      (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,uVar4,uVar8)
    ;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtxbuf_format
    [*(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914] = uVar3;
    pbVar1 = (byte *)((long)&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                             celsius_pipe_vtx_state + 1);
    *pbVar1 = *pbVar1 & 0xe0;
    lVar5 = 0;
    do {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtxbuf_format
      [lVar5] = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                celsius_pipe_vtxbuf_format[0] & 0x1000000 |
                (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                celsius_pipe_vtxbuf_format[lVar5] & 0xfeffffff;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 8);
    if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
        chipset.chipset == 0x10) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtxbuf_format[2]
           = ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
              celsius_pipe_vtxbuf_format[2] & 0xfffffffb) +
             (uint)(((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                     celsius_pipe_vtxbuf_format[1] & 7) != 0) * 4;
    }
    uVar8 = 8;
    do {
      uVar4 = uVar8 - 1;
      if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
           celsius_pipe_vtxbuf_format[uVar4] & 0x70) != 0) goto LAB_0020d8b2;
      uVar8 = uVar8 - 1;
    } while (1 < uVar8);
    uVar4 = 0;
LAB_0020d8b2:
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtx_state =
         uVar4 & 0x1f |
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtx_state &
         0xffffffe0;
  }
  return;
}

Assistant:

void emulate_mthd() override {
		uint32_t err = 0;
		int comp = extr(val, 4, 4);
		if (idx == 0) {
			if (extr(val, 24, 8) > 1)
				err |= 1;
			if (comp != 2 && comp != 3 && comp != 4)
				err |= 1;
		} else if (idx == 1 || idx == 2) {
			if (comp != 0 && comp != 3 && comp != 4)
				err |= 1;
		} else if (idx == 3 || idx == 4) {
			if (comp > 4)
				err |= 1;
		} else if (idx == 5) {
			if (comp != 0 && comp != 3)
				err |= 1;
		} else if (idx == 6 || idx == 7) {
			if (comp != 0 && comp != 1)
				err |= 1;
		}
		int fmt = extr(val, 0, 4);
		if (idx == 1 || idx == 2) {
			if (fmt != 0 && fmt != 2 && fmt != 4)
				err |= 1;
		} else {
			if (fmt != 1 && fmt != 2)
				err |= 1;
		}
		if (val & 0xff000000 && idx != 0)
			err |= 2;
		if (val & 0x00ff0300)
			err |= 2;
		if (extr(exp.celsius_config_c, 8, 1) && (cls == 0x56 || cls == 0x85))
			err |= 4;
		if (err) {
			warn(err);
		} else {
			if (!extr(exp.nsource, 1, 1)) {
				exp.celsius_pipe_vtxbuf_format[idx] = pgraph_celsius_fixup_vtxbuf_format(&exp, idx, val);
				insrt(exp.celsius_pipe_vtx_state, 8, 5, 0);
				for (int i = 0; i < 8; i++) {
					insrt(exp.celsius_pipe_vtxbuf_format[i], 24, 1, extr(exp.celsius_pipe_vtxbuf_format[0], 24, 1));
				}
				if (chipset.chipset == 0x10) {
					if (extr(exp.celsius_pipe_vtxbuf_format[1], 0, 3) == 0)
						insrt(exp.celsius_pipe_vtxbuf_format[2], 2, 1, 0);
					else
						insrt(exp.celsius_pipe_vtxbuf_format[2], 2, 1, 1);
				}
				int last = 7;
				while (last > 0 && extr(exp.celsius_pipe_vtxbuf_format[last], 4, 3) == 0)
					last--;
				insrt(exp.celsius_pipe_vtx_state, 0, 5, last);
			}
		}
	}